

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::RegistrationFailure::~RegistrationFailure(RegistrationFailure *this)

{
  void *in_RDI;
  
  ~RegistrationFailure((RegistrationFailure *)0x3477e8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit RegistrationFailure(std::string_view message = "registration failure") noexcept:
        HelicsException(message)
    {
    }